

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void stats_arena_mutexes_print(emitter_t *emitter,uint arena_ind,uint64_t uptime)

{
  tsd_t *ptVar1;
  int iVar2;
  char *in_RDX;
  long *in_FS_OFFSET;
  char *name;
  mutex_prof_arena_ind_t i;
  size_t miblen_new_1;
  size_t miblen_new;
  size_t stats_arenas_mib [7];
  emitter_col_t col32 [1];
  emitter_col_t col64 [11];
  emitter_col_t col_name;
  emitter_row_t row;
  tsd_t *tsd;
  tsd_t *tsd_1;
  char *in_stack_fffffffffffffd08;
  emitter_col_t *in_stack_fffffffffffffd10;
  emitter_col_t *in_stack_fffffffffffffd18;
  emitter_col_t *col_uint32_t;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  uint uVar3;
  size_t *in_stack_fffffffffffffd28;
  emitter_row_t *row_00;
  emitter_row_t *in_stack_fffffffffffffd30;
  tsd_t *tsd_00;
  emitter_col_t *in_stack_fffffffffffffdd0;
  emitter_col_t *in_stack_fffffffffffffdd8;
  emitter_col_t *in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  size_t in_stack_fffffffffffffdf0;
  size_t *in_stack_fffffffffffffdf8;
  uint64_t in_stack_ffffffffffffff50;
  emitter_row_t local_78;
  char *local_70;
  tsd_t *local_58;
  undefined1 local_4a;
  undefined1 local_49;
  tsd_t *local_48;
  tsd_t *local_40;
  undefined1 local_32;
  undefined1 local_31;
  tsd_t *local_30;
  undefined1 local_22;
  undefined1 local_21;
  tsd_t *local_20;
  tsd_t *local_18;
  tsd_t *local_10;
  tsd_t *local_8;
  
  local_70 = in_RDX;
  emitter_row_init(&local_78);
  mutex_stats_init_cols
            (in_stack_fffffffffffffd30,(char *)in_stack_fffffffffffffd28,
             (emitter_col_t *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  emitter_json_object_kv_begin((emitter_t *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  emitter_table_row((emitter_t *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                    (emitter_row_t *)in_stack_fffffffffffffd18);
  tsd_00 = (tsd_t *)0x7;
  local_49 = 1;
  local_4a = 0;
  local_21 = 1;
  local_58 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  local_48 = local_58;
  local_18 = local_58;
  ptVar1 = local_58;
  if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
    local_48 = duckdb_je_tsd_fetch_slow
                         ((tsd_t *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                          SUB81((ulong)in_stack_fffffffffffffd18 >> 0x38,0));
    ptVar1 = local_8;
  }
  local_8 = ptVar1;
  iVar2 = duckdb_je_ctl_mibnametomib
                    (tsd_00,in_stack_fffffffffffffd28,
                     CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                     (char *)in_stack_fffffffffffffd18,(size_t *)in_stack_fffffffffffffd10);
  if (iVar2 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in ctl_mibnametomib()\n");
    abort();
  }
  row_00 = (emitter_row_t *)0x7;
  local_31 = 1;
  local_32 = 0;
  local_22 = 1;
  local_40 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  local_30 = local_40;
  local_20 = local_40;
  ptVar1 = local_40;
  if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
    local_30 = duckdb_je_tsd_fetch_slow
                         ((tsd_t *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                          SUB81((ulong)in_stack_fffffffffffffd18 >> 0x38,0));
    ptVar1 = local_10;
  }
  local_10 = ptVar1;
  iVar2 = duckdb_je_ctl_mibnametomib
                    (tsd_00,(size_t *)row_00,
                     CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                     (char *)in_stack_fffffffffffffd18,(size_t *)in_stack_fffffffffffffd10);
  if (iVar2 == 0) {
    for (uVar3 = 0; uVar3 < 0xc; uVar3 = uVar3 + 1) {
      col_uint32_t = (emitter_col_t *)duckdb_je_arena_mutex_names[uVar3];
      emitter_json_object_kv_begin((emitter_t *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08)
      ;
      in_stack_fffffffffffffd08 = local_70;
      mutex_stats_read_arena
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                 in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                 in_stack_ffffffffffffff50);
      mutex_stats_emit((emitter_t *)tsd_00,row_00,
                       (emitter_col_t *)CONCAT44(uVar3,in_stack_fffffffffffffd20),col_uint32_t);
      emitter_json_object_end((emitter_t *)0x2573435);
    }
    emitter_json_object_end((emitter_t *)0x2573452);
    return;
  }
  duckdb_je_malloc_write("<jemalloc>: Failure in ctl_mibnametomib()\n");
  abort();
}

Assistant:

static void
stats_arena_mutexes_print(emitter_t *emitter, unsigned arena_ind, uint64_t uptime) {
	emitter_row_t row;
	emitter_col_t col_name;
	emitter_col_t col64[mutex_prof_num_uint64_t_counters];
	emitter_col_t col32[mutex_prof_num_uint32_t_counters];

	emitter_row_init(&row);
	mutex_stats_init_cols(&row, "", &col_name, col64, col32);

	emitter_json_object_kv_begin(emitter, "mutexes");
	emitter_table_row(emitter, &row);

	size_t stats_arenas_mib[CTL_MAX_DEPTH];
	CTL_LEAF_PREPARE(stats_arenas_mib, 0, "stats.arenas");
	stats_arenas_mib[2] = arena_ind;
	CTL_LEAF_PREPARE(stats_arenas_mib, 3, "mutexes");

	for (mutex_prof_arena_ind_t i = 0; i < mutex_prof_num_arena_mutexes;
	    i++) {
		const char *name = arena_mutex_names[i];
		emitter_json_object_kv_begin(emitter, name);
		mutex_stats_read_arena(stats_arenas_mib, 4, name, &col_name,
		    col64, col32, uptime);
		mutex_stats_emit(emitter, &row, col64, col32);
		emitter_json_object_end(emitter); /* Close the mutex dict. */
	}
	emitter_json_object_end(emitter); /* End "mutexes". */
}